

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void geopolyOverlapFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  GeoPoly *pGVar2;
  GeoPoly *pGVar3;
  int *in_RDI;
  sqlite3_value *unaff_retaddr;
  sqlite3_context *in_stack_00000008;
  int x;
  GeoPoly *p2;
  GeoPoly *p1;
  GeoPoly *in_stack_00000048;
  GeoPoly *in_stack_00000050;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  
  pGVar2 = geopolyFuncParam(in_stack_00000008,unaff_retaddr,in_RDI);
  pGVar3 = geopolyFuncParam(in_stack_00000008,unaff_retaddr,in_RDI);
  if ((pGVar2 != (GeoPoly *)0x0) && (pGVar3 != (GeoPoly *)0x0)) {
    iVar1 = geopolyOverlap(in_stack_00000050,in_stack_00000048);
    if (iVar1 < 0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x2a0231);
    }
    else {
      sqlite3_result_int((sqlite3_context *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffcc);
    }
  }
  sqlite3_free((void *)0x2a024d);
  sqlite3_free((void *)0x2a0257);
  return;
}

Assistant:

static void geopolyOverlapFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p1 = geopolyFuncParam(context, argv[0], 0);
  GeoPoly *p2 = geopolyFuncParam(context, argv[1], 0);
  (void)argc;
  if( p1 && p2 ){
    int x = geopolyOverlap(p1, p2);
    if( x<0 ){
      sqlite3_result_error_nomem(context);
    }else{
      sqlite3_result_int(context, x);
    }
  }
  sqlite3_free(p1);
  sqlite3_free(p2);
}